

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O0

int Ssc_GiaCountCaresSim(Gia_Man_t *p)

{
  int iVar1;
  word *pSim;
  int Count;
  int nWords;
  word *pRes;
  Gia_Man_t *p_local;
  
  pSim = Ssc_GiaGetCareMask(p);
  iVar1 = Gia_ObjSimWords(p);
  iVar1 = Ssc_SimCountBits(pSim,iVar1);
  if (pSim != (word *)0x0) {
    free(pSim);
  }
  return iVar1;
}

Assistant:

int Ssc_GiaCountCaresSim( Gia_Man_t * p )
{
    word * pRes = Ssc_GiaGetCareMask( p );
    int nWords = Gia_ObjSimWords( p );
    int Count = Ssc_SimCountBits( pRes, nWords );
    ABC_FREE( pRes );
    return Count;
}